

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::PrintTimeScaleTask::checkArguments
          (PrintTimeScaleTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  Type *pTVar2;
  size_type sVar3;
  reference ppEVar4;
  Symbol *this_01;
  SystemSubroutine *in_RCX;
  Args *in_RDX;
  undefined8 in_RSI;
  undefined1 isMethod;
  ASTContext *in_RDI;
  SourceLocation in_R8;
  size_t in_stack_00000010;
  size_t in_stack_00000018;
  Symbol *sym;
  Compilation *comp;
  DiagCode code;
  ASTContext *context_00;
  SourceLocation in_stack_fffffffffffffff8;
  
  isMethod = (undefined1)((ulong)in_RSI >> 0x38);
  context_00 = in_RDI;
  this_00 = ASTContext::getCompilation((ASTContext *)0x9a1eaf);
  callRange.endLoc = in_stack_fffffffffffffff8;
  callRange.startLoc = in_R8;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_RCX,context_00,(bool)isMethod,in_RDX,callRange,in_stack_00000010,
                     in_stack_00000018);
  if (bVar1) {
    sVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                      ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x9a1f26
                      );
    if (sVar3 != 0) {
      ppEVar4 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                          (in_RDX,0);
      Expression::as<slang::ast::ArbitrarySymbolExpression>(*ppEVar4);
      this_01 = not_null<const_slang::ast::Symbol_*>::operator*
                          ((not_null<const_slang::ast::Symbol_*> *)0x9a1f52);
      if (((this_01->kind != Instance) && (this_01->kind != CompilationUnit)) &&
         (this_01->kind != Root)) {
        not_null<const_slang::ast::Scope_*>::operator->
                  ((not_null<const_slang::ast::Scope_*> *)0x9a1f87);
        bVar1 = Scope::isUninstantiated((Scope *)this_01);
        if (!bVar1) {
          code.subsystem = SysFuncs;
          code.code = 0xb;
          ppEVar4 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
                    operator[](in_RDX,0);
          ASTContext::addDiag(in_RDI,code,(*ppEVar4)->sourceRange);
        }
        pTVar2 = Compilation::getErrorType(this_00);
        return pTVar2;
      }
    }
    pTVar2 = Compilation::getVoidType(this_00);
  }
  else {
    pTVar2 = Compilation::getErrorType(this_00);
  }
  return pTVar2;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 0, 1))
            return comp.getErrorType();

        if (args.size() > 0) {
            auto& sym = *args[0]->as<ArbitrarySymbolExpression>().symbol;
            if (sym.kind != SymbolKind::Instance && sym.kind != SymbolKind::CompilationUnit &&
                sym.kind != SymbolKind::Root) {
                if (!context.scope->isUninstantiated())
                    context.addDiag(diag::ExpectedModuleName, args[0]->sourceRange);
                return comp.getErrorType();
            }
        }

        return comp.getVoidType();
    }